

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

TextureCubeArrayView
tcu::getEffectiveTView<tcu::TextureCubeArrayView>
          (TextureCubeArrayView *src,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *storage
          ,Sampler *sampler)

{
  TextureFormat *pTVar1;
  undefined8 *puVar2;
  pointer pCVar3;
  long lVar4;
  long lVar5;
  TextureCubeArrayView TVar6;
  TextureCubeArrayView view;
  TextureCubeArrayView local_68;
  undefined1 local_58 [24];
  int aiStack_40 [2];
  void *local_38;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
            (storage,(long)src->m_numLevels);
  TextureCubeArrayView::TextureCubeArrayView
            (&local_68,src->m_numLevels,
             (storage->
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             )._M_impl.super__Vector_impl_data._M_start);
  if (0 < src->m_numLevels) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      toSamplerAccess<tcu::ConstPixelBufferAccess>
                ((ConstPixelBufferAccess *)local_58,
                 (ConstPixelBufferAccess *)((long)(src->m_levels->m_size).m_data + lVar5 + -8),
                 sampler->depthStencilMode);
      pCVar3 = (storage->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(void **)((long)(&pCVar3->m_pitch + 1) + lVar5) = local_38;
      puVar2 = (undefined8 *)((long)(pCVar3->m_size).m_data + lVar5 + 8);
      *puVar2 = local_58._16_8_;
      puVar2[1] = aiStack_40;
      pTVar1 = (TextureFormat *)((long)(pCVar3->m_size).m_data + lVar5 + -8);
      pTVar1->order = local_58._0_4_;
      pTVar1->type = local_58._4_4_;
      pTVar1[1].order = local_58._8_4_;
      pTVar1[1].type = local_58._12_4_;
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar4 < src->m_numLevels);
  }
  TVar6._4_4_ = 0;
  TVar6.m_numLevels = local_68.m_numLevels;
  TVar6.m_levels = local_68.m_levels;
  return TVar6;
}

Assistant:

ViewType getEffectiveTView (const ViewType& src, std::vector<tcu::ConstPixelBufferAccess>& storage, const tcu::Sampler& sampler)
{
	storage.resize(src.getNumLevels());

	ViewType view = ViewType(src.getNumLevels(), &storage[0]);

	for (int levelNdx = 0; levelNdx < src.getNumLevels(); ++levelNdx)
		storage[levelNdx] = tcu::getEffectiveDepthStencilAccess(src.getLevel(levelNdx), sampler.depthStencilMode);

	return view;
}